

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FragmentStamp.cpp
# Opt level: O0

void __thiscall OpenMD::FragmentStamp::FragmentStamp(FragmentStamp *this)

{
  undefined8 *in_RDI;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebf;
  DataHolder *in_stack_fffffffffffffec0;
  value_type *__x;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  *this_00;
  allocator<char> *__a;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  undefined1 local_89 [80];
  allocator<char> local_39;
  string local_38 [56];
  
  DataHolder::DataHolder(in_stack_fffffffffffffec0);
  *in_RDI = &PTR__FragmentStamp_00502160;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parameter((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_fffffffffffffec0);
  std::vector<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>::vector
            ((vector<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_> *)0x29f072);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x29f08b);
  std::vector<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>::vector
            ((vector<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_> *)0x29f0a4);
  __a = (allocator<char> *)(in_RDI + 0x21);
  std::vector<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>::vector
            ((vector<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_> *)0x29f0bd);
  __s = (char *)(in_RDI + 0x24);
  std::vector<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_>::vector
            ((vector<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_> *)0x29f0d6);
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x27);
  std::vector<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>::vector
            ((vector<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_> *)0x29f0ef
            );
  std::vector<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>::vector
            ((vector<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_> *)0x29f108
            );
  std::vector<OpenMD::CutoffGroupStamp_*,_std::allocator<OpenMD::CutoffGroupStamp_*>_>::vector
            ((vector<OpenMD::CutoffGroupStamp_*,_std::allocator<OpenMD::CutoffGroupStamp_*>_> *)
             0x29f121);
  std::vector<OpenMD::ConstraintStamp_*,_std::allocator<OpenMD::ConstraintStamp_*>_>::vector
            ((vector<OpenMD::ConstraintStamp_*,_std::allocator<OpenMD::ConstraintStamp_*>_> *)
             0x29f13a);
  std::vector<OpenMD::NodesStamp_*,_std::allocator<OpenMD::NodesStamp_*>_>::vector
            ((vector<OpenMD::NodesStamp_*,_std::allocator<OpenMD::NodesStamp_*>_> *)0x29f153);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x29f16c);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x29f185);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,__s,__a);
  ParameterBase::setKeyword
            ((ParameterBase *)in_stack_fffffffffffffec0,
             (string *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  __x = (value_type *)(in_RDI + 1);
  this_00 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
             *)local_89;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,__s,__a);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (this_00,&__x->first,(ParameterBase **)in_stack_fffffffffffffec0);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
  ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
            *)this_00,__x);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x29f2b0);
  std::__cxx11::string::~string((string *)(local_89 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_89);
  return;
}

Assistant:

FragmentStamp::FragmentStamp() { DefineParameter(Name, "name"); }